

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

uint Assimp::StandardShapes::MakeIcosahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  size_type sVar1;
  double dVar2;
  aiVector3t<float> aVar3;
  value_type local_250;
  aiVector3t<float> local_240;
  undefined1 local_234 [8];
  aiVector3D v11;
  aiVector3t<float> local_214;
  undefined1 local_208 [8];
  aiVector3D v10;
  aiVector3t<float> local_1e4;
  undefined1 local_1d8 [8];
  aiVector3D v9;
  aiVector3t<float> local_1b4;
  undefined1 local_1a8 [8];
  aiVector3D v8;
  aiVector3t<float> local_184;
  undefined1 local_178 [8];
  aiVector3D v7;
  aiVector3t<float> local_154;
  undefined1 local_148 [8];
  aiVector3D v6;
  aiVector3t<float> local_124;
  undefined1 local_118 [8];
  aiVector3D v5;
  aiVector3t<float> local_f4;
  undefined1 local_e8 [8];
  aiVector3D v4;
  aiVector3t<float> local_c4;
  undefined1 local_b8 [8];
  aiVector3D v3;
  aiVector3t<float> local_94;
  undefined1 local_88 [8];
  aiVector3D v2;
  aiVector3t<float> local_64;
  undefined1 local_58 [8];
  aiVector3D v1;
  float fStack_44;
  float local_40;
  aiVector3t<float> local_34;
  undefined1 local_28 [8];
  aiVector3D v0;
  ai_real s;
  ai_real t;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions_local;
  
  sVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(positions);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,sVar1 + 0x3c);
  dVar2 = std::sqrt(5.33851937586592e-315);
  v0.z = SUB84(dVar2,0);
  aiVector3t<float>::aiVector3t(&local_34,1.618034,1.0,0.0);
  aVar3 = ::operator/(&local_34,v0.z);
  local_40 = aVar3.z;
  v0.x = local_40;
  stack0xffffffffffffffb8 = aVar3._0_8_;
  local_28._0_4_ = v1.z;
  local_28._4_4_ = fStack_44;
  unique0x100008f3 = aVar3;
  aiVector3t<float>::aiVector3t(&local_64,-1.618034,1.0,0.0);
  aVar3 = ::operator/(&local_64,v0.z);
  v1.x = aVar3.z;
  unique0x1000036f = aVar3._0_8_;
  local_58 = (undefined1  [8])unique0x1000036f;
  aiVector3t<float>::aiVector3t(&local_94,1.618034,-1.0,0.0);
  aVar3 = ::operator/(&local_94,v0.z);
  v2.x = aVar3.z;
  unique0x10000317 = aVar3._0_8_;
  local_88 = (undefined1  [8])unique0x10000317;
  aiVector3t<float>::aiVector3t(&local_c4,-1.618034,-1.0,0.0);
  aVar3 = ::operator/(&local_c4,v0.z);
  v3.x = aVar3.z;
  unique0x1000031f = aVar3._0_8_;
  local_b8 = (undefined1  [8])unique0x1000031f;
  aiVector3t<float>::aiVector3t(&local_f4,1.0,0.0,1.618034);
  aVar3 = ::operator/(&local_f4,v0.z);
  v4.x = aVar3.z;
  unique0x10000327 = aVar3._0_8_;
  local_e8 = (undefined1  [8])unique0x10000327;
  aiVector3t<float>::aiVector3t(&local_124,1.0,0.0,-1.618034);
  aVar3 = ::operator/(&local_124,v0.z);
  v5.x = aVar3.z;
  unique0x1000032f = aVar3._0_8_;
  local_118 = (undefined1  [8])unique0x1000032f;
  aiVector3t<float>::aiVector3t(&local_154,-1.0,0.0,1.618034);
  aVar3 = ::operator/(&local_154,v0.z);
  v6.x = aVar3.z;
  unique0x10000337 = aVar3._0_8_;
  local_148 = (undefined1  [8])unique0x10000337;
  aiVector3t<float>::aiVector3t(&local_184,-1.0,0.0,-1.618034);
  aVar3 = ::operator/(&local_184,v0.z);
  v7.x = aVar3.z;
  unique0x1000033f = aVar3._0_8_;
  local_178 = (undefined1  [8])unique0x1000033f;
  aiVector3t<float>::aiVector3t(&local_1b4,0.0,1.618034,1.0);
  aVar3 = ::operator/(&local_1b4,v0.z);
  v8.x = aVar3.z;
  unique0x10000347 = aVar3._0_8_;
  local_1a8 = (undefined1  [8])unique0x10000347;
  aiVector3t<float>::aiVector3t(&local_1e4,0.0,-1.618034,1.0);
  aVar3 = ::operator/(&local_1e4,v0.z);
  v9.x = aVar3.z;
  unique0x1000034f = aVar3._0_8_;
  local_1d8 = (undefined1  [8])unique0x1000034f;
  aiVector3t<float>::aiVector3t(&local_214,0.0,1.618034,-1.0);
  aVar3 = ::operator/(&local_214,v0.z);
  v10.x = aVar3.z;
  v11._4_8_ = aVar3._0_8_;
  local_208 = (undefined1  [8])v11._4_8_;
  aiVector3t<float>::aiVector3t(&local_240,0.0,-1.618034,-1.0);
  aVar3 = ::operator/(&local_240,v0.z);
  local_250._0_8_ = aVar3._0_8_;
  local_234._0_4_ = local_250.x;
  local_234._4_4_ = local_250.y;
  local_250.z = aVar3.z;
  v11.x = local_250.z;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_28);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1a8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_e8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_28);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_118);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_208);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_88);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_e8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1d8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_88);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_234);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_118);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_148);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1a8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_208);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_178);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_b8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1d8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_148);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_b8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_178);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_234);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_28);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_208);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1a8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1a8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_208);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_88);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1d8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_234);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_b8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_234);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1d8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_e8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_88);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_28);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_118);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_28);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_88);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_148);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_b8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_178);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_b8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1a8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_148);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_e8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_1d8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_e8);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_148);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_208);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_118);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_178);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_234);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_178);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_118);
  return 3;
}

Assistant:

unsigned int StandardShapes::MakeIcosahedron(std::vector<aiVector3D>& positions)
{
    positions.reserve(positions.size()+60);

    const ai_real t = ( ai_real( 1.0 )+ ai_real( 2.236067977 ) ) / ai_real( 2.0 );
    const ai_real s = std::sqrt(ai_real(1.0) + t*t);

    const aiVector3D v0  = aiVector3D(t,1.0, 0.0)/s;
    const aiVector3D v1  = aiVector3D(-t,1.0, 0.0)/s;
    const aiVector3D v2  = aiVector3D(t,-1.0, 0.0)/s;
    const aiVector3D v3  = aiVector3D(-t,-1.0, 0.0)/s;
    const aiVector3D v4  = aiVector3D(1.0, 0.0, t)/s;
    const aiVector3D v5  = aiVector3D(1.0, 0.0,-t)/s;
    const aiVector3D v6  = aiVector3D(-1.0, 0.0,t)/s;
    const aiVector3D v7  = aiVector3D(-1.0, 0.0,-t)/s;
    const aiVector3D v8  = aiVector3D(0.0, t, 1.0)/s;
    const aiVector3D v9  = aiVector3D(0.0,-t, 1.0)/s;
    const aiVector3D v10 = aiVector3D(0.0, t,-1.0)/s;
    const aiVector3D v11 = aiVector3D(0.0,-t,-1.0)/s;

    ADD_TRIANGLE(v0,v8,v4);
    ADD_TRIANGLE(v0,v5,v10);
    ADD_TRIANGLE(v2,v4,v9);
    ADD_TRIANGLE(v2,v11,v5);

    ADD_TRIANGLE(v1,v6,v8);
    ADD_TRIANGLE(v1,v10,v7);
    ADD_TRIANGLE(v3,v9,v6);
    ADD_TRIANGLE(v3,v7,v11);

    ADD_TRIANGLE(v0,v10,v8);
    ADD_TRIANGLE(v1,v8,v10);
    ADD_TRIANGLE(v2,v9,v11);
    ADD_TRIANGLE(v3,v11,v9);

    ADD_TRIANGLE(v4,v2,v0);
    ADD_TRIANGLE(v5,v0,v2);
    ADD_TRIANGLE(v6,v1,v3);
    ADD_TRIANGLE(v7,v3,v1);

    ADD_TRIANGLE(v8,v6,v4);
    ADD_TRIANGLE(v9,v4,v6);
    ADD_TRIANGLE(v10,v5,v7);
    ADD_TRIANGLE(v11,v7,v5);
    return 3;
}